

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignEnumEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
  *pMVar1;
  bool bVar2;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  ForeignEnum *pFVar3;
  AssertionResult *rhs_container;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  *matcher;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar4;
  char *in_R9;
  Cord *output;
  string_view data;
  AssertHelper local_228;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  AssertHelper local_1f0;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  local_1e8;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&msg);
  rhs_container = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  gtest_ar__2.success_ = false;
  gtest_ar__2._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&rt_msg,"static_cast<uint32_t>(FOREIGN_FOO)","0",(uint *)rhs_container,
             (int *)&gtest_ar__2);
  if ((char)rt_msg.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (rt_msg.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)rt_msg.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3aa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rt_msg.super_Message.super_MessageLite._internal_metadata_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&rt_msg.super_Message.super_MessageLite._internal_metadata_);
    pMVar1 = &msg.field_0._impl_.map_int32_foreign_enum_;
    this_00 = internal::TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::
              MutableMap(&pMVar1->
                          super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                        );
    rt_msg.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 0;
    pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::operator[]<int>
                       (this_00,(key_arg<int> *)&rt_msg);
    *pFVar3 = FOREIGN_FOO;
    output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
    bVar2 = MessageLite::SerializeToString((MessageLite *)&msg,output);
    gtest_ar_.success_ = bVar2;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar2) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      absl::lts_20250127::Cord::operator_cast_to_string((string *)&rt_msg,output);
      gtest_ar_.success_ = rt_msg.super_Message.super_MessageLite._internal_metadata_.ptr_ != 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&rt_msg);
      if (gtest_ar_.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&rt_msg);
        absl::lts_20250127::Cord::operator_cast_to_string((string *)&gtest_ar_,output);
        data._M_str._4_4_ = gtest_ar_._4_4_;
        data._M_str._0_1_ = gtest_ar_.success_;
        data._M_str._1_3_ = gtest_ar_._1_3_;
        data._M_len = (size_t)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        bVar2 = MessageLite::ParseFromString((MessageLite *)&rt_msg,data);
        gtest_ar__2.success_ = bVar2;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (gtest_ar__2.success_ == false) {
          testing::Message::Message((Message *)&local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                     (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                     in_R9);
          rhs_container = (AssertionResult *)0x3b5;
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3b5,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
          testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_1f0);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)CONCAT44(local_228.data_._4_4_,local_228.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,local_228.data_._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)pMVar1);
        testing::
        UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>>
                  (&local_1e8,(testing *)&local_228,
                   (Eq2Matcher *)
                   &msg.field_0._impl_.map_int32_foreign_enum_.
                    super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                    .field_0.map_,
                   (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)rhs_container);
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
                  ((PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                    *)&gtest_ar_,(internal *)&local_1e8,matcher);
        pMVar1 = &rt_msg.field_0._impl_.map_int32_foreign_enum_;
        internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)pMVar1);
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
        ::operator()(&gtest_ar__2,&gtest_ar_.success_,
                     (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
                     "rt_msg.map_int32_foreign_enum()");
        std::
        _Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
        ::~_Vector_base((_Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                         *)&gtest_ar_.message_);
        std::
        _Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
        ::~_Vector_base(&local_1e8.matchers_.
                         super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                       );
        if (gtest_ar__2.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar__2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar4 = *(char **)gtest_ar__2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3b7,pcVar4);
          testing::internal::AssertHelper::operator=(&local_228,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_228);
          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        gtest_ar__2.success_ = false;
        gtest_ar__2._1_3_ = 0;
        internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)pMVar1);
        local_228.data_._0_4_ = 0;
        pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::at<int>
                           (&rt_msg.field_0._impl_.map_int32_foreign_enum_.
                             super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                             .field_0.map_,(key_arg<int> *)&local_228);
        testing::internal::
        CmpHelperEQ<proto2_nofieldpresence_unittest::ForeignEnum,proto2_nofieldpresence_unittest::ForeignEnum>
                  ((internal *)&gtest_ar_,"FOREIGN_FOO","rt_msg.map_int32_foreign_enum().at(0)",
                   (ForeignEnum *)&gtest_ar__2,pFVar3);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar4 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3bb,pcVar4);
          testing::internal::AssertHelper::operator=(&local_228,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper(&local_228);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&rt_msg);
        goto LAB_006e7b41;
      }
      testing::Message::Message((Message *)&gtest_ar__2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rt_msg,(internal *)&gtest_ar_,
                 (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3b1,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                         _4_4_,rt_msg.super_Message.super_MessageLite.
                                               _vptr_MessageLite._0_4_));
      testing::internal::AssertHelper::operator=(&local_228,(Message *)&gtest_ar__2);
    }
    else {
      testing::Message::Message((Message *)&gtest_ar__2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rt_msg,(internal *)&gtest_ar_,
                 (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3af,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                         _4_4_,rt_msg.super_Message.super_MessageLite.
                                               _vptr_MessageLite._0_4_));
      testing::internal::AssertHelper::operator=(&local_228,(Message *)&gtest_ar__2);
    }
    this_01 = &gtest_ar_.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&rt_msg);
    if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_006e7b41:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&msg);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_EQ(static_cast<uint32_t>(FOREIGN_FOO), 0);
  (*msg.mutable_map_int32_foreign_enum())[0] = FOREIGN_FOO;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_FOO, rt_msg.map_int32_foreign_enum().at(0));
}